

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O0

uint __thiscall BigNumber::numOfTrimCharsOnLeft(BigNumber *this,string *str)

{
  long lVar1;
  char *pcVar2;
  bool bVar3;
  undefined8 local_28;
  size_t i;
  uint numOfChars;
  string *str_local;
  BigNumber *this_local;
  
  i._4_4_ = 0;
  local_28 = 0;
  do {
    lVar1 = std::__cxx11::string::size();
    if (local_28 < lVar1 - 1U) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
      bVar3 = true;
      if (*pcVar2 != '0') goto LAB_00106efa;
    }
    else {
LAB_00106efa:
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
      bVar3 = true;
      if (*pcVar2 != '-') {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
        bVar3 = *pcVar2 == '+';
      }
    }
    if (!bVar3) {
      return i._4_4_;
    }
    i._4_4_ = i._4_4_ + 1;
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

unsigned BigNumber::numOfTrimCharsOnLeft(const std::string &str) {
    unsigned numOfChars = 0;
    size_t i = 0;
    while( i < str.size() - 1 && str[i] == '0' || str[i] == '-' || str[i] == '+'){
        ++numOfChars;
        ++i;
    }
    return numOfChars;
}